

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsCLI11JsonConfig.cpp
# Opt level: O2

vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> * __thiscall
helics::HelicsConfigJSON::from_config
          (vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *__return_storage_ptr__,
          HelicsConfigJSON *this,istream *input)

{
  value_t vVar1;
  json_value jVar2;
  json config;
  string errs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  string local_b8;
  data local_98;
  data local_88;
  _Any_data local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  
  errs._M_dataplus._M_p = (pointer)&errs.field_2;
  errs._M_string_length = 0;
  errs.field_2._M_local_buf[0] = '\0';
  if (this->mSkipJson == false) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json(&config,(nullptr_t)0x0);
    local_68 = 0;
    uStack_60 = 0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
    ::parse<std::istream&>
              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)&local_88,input,(parser_callback_t *)&local_78,true,true);
    jVar2 = config.m_data.m_value;
    vVar1 = config.m_data.m_type;
    config.m_data.m_type = local_88.m_type;
    local_88.m_type = vVar1;
    config.m_data.m_value = local_88.m_value;
    local_88.m_value = jVar2;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_88);
    std::_Function_base::~_Function_base((_Function_base *)&local_78);
    getSection((helics *)&local_98,&config,&(this->super_ConfigBase).configSection,
               (this->super_ConfigBase).configIndex);
    jVar2 = config.m_data.m_value;
    vVar1 = config.m_data.m_type;
    config.m_data.m_type = local_98.m_type;
    local_98.m_type = vVar1;
    config.m_data.m_value = local_98.m_value;
    local_98.m_value = jVar2;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_98);
    if (config.m_data.m_type == null) {
      if (this->mFallbackToDefault == true) {
        CLI::ConfigBase::from_config(__return_storage_ptr__,&this->super_ConfigBase,input);
      }
      else {
        (__return_storage_ptr__->
        super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
    }
    else {
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_local_buf[0] = '\0';
      local_d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      fromConfigInternal(__return_storage_ptr__,this,&config,&local_b8,&local_d8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_d8);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&config.m_data);
  }
  else {
    CLI::ConfigBase::from_config(__return_storage_ptr__,&this->super_ConfigBase,input);
  }
  std::__cxx11::string::~string((string *)&errs);
  return __return_storage_ptr__;
}

Assistant:

std::vector<CLI::ConfigItem> HelicsConfigJSON::from_config(std::istream& input) const
{
    std::string errs;
    if (!mSkipJson) {
        nlohmann::json config;
        try {
            config = nlohmann::json::parse(input, nullptr, true, true);
            config = getSection(config, section(), configIndex);
            if (config.is_null()) {
                if (mFallbackToDefault) {
                    return ConfigBase::from_config(input);
                }
                return {};
            }
            return fromConfigInternal(config);
        }
        catch (const nlohmann::json::parse_error& err) {
            errs = err.what();
        }
        if (mThrowJsonErrors && !errs.empty()) {
            throw(CLI::FileError(errs));
        }
    }
    return ConfigBase::from_config(input);
}